

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O0

void PPC_init(MCRegisterInfo *MRI)

{
  MCRegisterInfo *MRI_local;
  
  MCRegisterInfo_InitMCRegisterInfo
            (MRI,PPCRegDesc,0x117,0,0,PPCMCRegisterClasses,0x15,(uint16_t (*) [2])0x0,0,
             PPCRegDiffLists,(char *)0x0,PPCSubRegIdxLists,8,(uint16_t *)0x0);
  return;
}

Assistant:

void PPC_init(MCRegisterInfo *MRI)
{
	/*
	InitMCRegisterInfo(PPCRegDesc, 279, RA, PC,
			PPCMCRegisterClasses, 21,
			PPCRegUnitRoots,
			146,
			PPCRegDiffLists,
			PPCRegStrings,
			PPCSubRegIdxLists,
			8,
			PPCSubRegIdxRanges,
			PPCRegEncodingTable);
	*/

	MCRegisterInfo_InitMCRegisterInfo(MRI, PPCRegDesc, 279,
			0, 0,
			PPCMCRegisterClasses, 21,
			0, 0,
			PPCRegDiffLists,
			0,
			PPCSubRegIdxLists, 8,
			0);
}